

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# post_function.cc
# Opt level: O2

int main(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  basic_ostream<char,_std::char_traits<char>_> *pbVar5;
  sample<std::complex<double>_> *desired_00;
  int step;
  long lVar6;
  int *__last;
  bool bVar7;
  int desired;
  sample<std::complex<double>_> local_b8;
  teacher<klogic::mvn,_klogic::learning::sample<std::complex<double>_>,_klogic::learning::learn_error<std::complex<double>_>_>
  teacher;
  mvn neuron;
  vector<int,_std::allocator<int>_> input;
  
  klogic::mvn::mvn(&neuron,3,2);
  local_b8.input.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.input.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.input.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<klogic::learning::sample<std::complex<double>_>,_std::allocator<klogic::learning::sample<std::complex<double>_>_>_>
  ::vector(&teacher._samples,
           (vector<klogic::learning::sample<std::complex<double>_>,_std::allocator<klogic::learning::sample<std::complex<double>_>_>_>
            *)&local_b8);
  teacher.learner = &neuron;
  std::
  vector<klogic::learning::sample<std::complex<double>_>,_std::allocator<klogic::learning::sample<std::complex<double>_>_>_>
  ::~vector((vector<klogic::learning::sample<std::complex<double>_>,_std::allocator<klogic::learning::sample<std::complex<double>_>_>_>
             *)&local_b8);
  lVar6 = 9;
  __last = learning_samples[0] + 2;
  while (bVar7 = lVar6 != 0, lVar6 = lVar6 + -1, bVar7) {
    desired_00 = &local_b8;
    std::vector<int,std::allocator<int>>::vector<int_const*,void>
              ((vector<int,std::allocator<int>> *)&input,(int *)(__last + -2),__last,
               (allocator_type *)&local_b8);
    desired = *__last;
    klogic::transform::discrete<3,std::complex<double>,int>
              (&local_b8,(transform *)&input,(vector<int,_std::allocator<int>_> *)&desired,
               (int *)desired_00);
    std::
    vector<klogic::learning::sample<std::complex<double>_>,_std::allocator<klogic::learning::sample<std::complex<double>_>_>_>
    ::push_back(&teacher._samples,&local_b8);
    std::_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>::~_Vector_base
              ((_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
               &local_b8);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&input);
    __last = __last + 3;
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"Before hits: ");
  iVar1 = klogic::learning::
          teacher<klogic::mvn,klogic::learning::sample<std::complex<double>>,klogic::learning::learn_error<std::complex<double>>>
          ::hits<klogic::learning::single_discrete_match<3>>
                    ((teacher<klogic::mvn,klogic::learning::sample<std::complex<double>>,klogic::learning::learn_error<std::complex<double>>>
                      *)&teacher,(single_discrete_match<3> *)&local_b8);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar1);
  std::endl<char,std::char_traits<char>>(poVar4);
  iVar1 = 1;
  do {
    klogic::learning::
    teacher<klogic::mvn,_klogic::learning::sample<std::complex<double>_>,_klogic::learning::learn_error<std::complex<double>_>_>
    ::learn_run(&teacher);
    iVar2 = klogic::learning::
            teacher<klogic::mvn,klogic::learning::sample<std::complex<double>>,klogic::learning::learn_error<std::complex<double>>>
            ::hits<klogic::learning::single_discrete_match<3>>
                      ((teacher<klogic::mvn,klogic::learning::sample<std::complex<double>>,klogic::learning::learn_error<std::complex<double>>>
                        *)&teacher,(single_discrete_match<3> *)&local_b8);
    poVar4 = std::operator<<((ostream *)&std::cout,"After step ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar1);
    poVar4 = std::operator<<(poVar4," hits: ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
    std::endl<char,std::char_traits<char>>(poVar4);
    iVar3 = klogic::learning::
            teacher<klogic::mvn,_klogic::learning::sample<std::complex<double>_>,_klogic::learning::learn_error<std::complex<double>_>_>
            ::samples_count(&teacher);
    iVar1 = iVar1 + 1;
  } while (iVar2 != iVar3);
  poVar4 = std::operator<<((ostream *)&std::cout,"MVN weights:");
  poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
  pbVar5 = klogic::operator<<((basic_ostream<char,_std::char_traits<char>_> *)poVar4,&neuron.weights
                             );
  std::endl<char,std::char_traits<char>>((ostream *)pbVar5);
  std::
  vector<klogic::learning::sample<std::complex<double>_>,_std::allocator<klogic::learning::sample<std::complex<double>_>_>_>
  ::~vector(&teacher._samples);
  std::_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>::~_Vector_base
            ((_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&neuron);
  return 0;
}

Assistant:

int main()
{
    using namespace std;
    using namespace klogic;
    using namespace klogic::learning;
    using namespace klogic::transform;

    mvn neuron(K, 2);
    teacher<mvn> teacher(neuron);

    for (int i = 0; i < nsamples; ++i) {
        const int *inp_beg = &learning_samples[i][0], *inp_end = inp_beg + 2;
        vector<int> input(inp_beg, inp_end);
        int desired = inp_beg[2];

        teacher.add_sample(discrete<K, cmplx>(input, desired));
    }

    // cout << "Samples:" << endl << teacher.samples() << endl;

    cout << "Before hits: " << teacher.hits<single_discrete_match<K> >() << endl;

    for (int step = 1;; ++step) {
        // cout << "MVN weights:" << endl << neuron.weights_vector() << endl;

        teacher.learn_run();

        int hits = teacher.hits<single_discrete_match<K> >();

        cout << "After step " << step << " hits: " << hits << endl;

        if (hits == teacher.samples_count())
            break;
    }

    cout << "MVN weights:" << endl << neuron.weights_vector() << endl;

    return 0;
}